

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FutureStd.cpp
# Opt level: O1

void testFutureStd(int iterations)

{
  long lVar1;
  long lVar2;
  future<long> future;
  int local_4c;
  code *local_48;
  future<long> local_40;
  
  local_4c = 0;
  lVar2 = 0;
  if (0 < iterations) {
    do {
      local_48 = testFutureStd::A::testProc;
      std::async<long(*)(long),int&>((launch)&local_40,(_func_long_long **)0x3,(int *)&local_48);
      lVar1 = std::future<long>::get(&local_40);
      if (local_40.super___basic_future<long>._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_40.super___basic_future<long>._M_state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      lVar2 = lVar2 + lVar1;
      local_4c = local_4c + 1;
    } while (local_4c < iterations);
  }
  if (lVar2 == ((long)(iterations + -1) * (long)iterations) / 2) {
    return;
  }
  puts("fail");
  std::terminate();
}

Assistant:

void testFutureStd(int iterations)
{
  struct A
  {
    static int64_t testProc(int64_t i)
    {
      return i;
    }
  };

  int64_t result = 0;
  for(int i = 0; i < iterations; ++i)
  {
    std::future<int64_t> future = std::async(&A::testProc, i);
    result += future.get();
  }
  if(result != (int64_t)iterations * (int64_t)(iterations - 1) / 2)
  {
    printf("fail\n");
    std::terminate();
  }
}